

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

void __thiscall Tigre::String::String(String *this,char *s)

{
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)this);
  return;
}

Assistant:

Tigre::String::String(const char s[]){
    this->value = s;
}